

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

AffineSpace3fa * __thiscall embree::Camera::camera2world(Camera *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  runtime_error *this_00;
  uint uVar29;
  undefined8 *in_RSI;
  AffineSpace3fa *in_RDI;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  AffineSpace3fa *local2world;
  __m128 mask;
  Vector V;
  Vector U;
  Vector Z;
  vfloat4 b1_1;
  vfloat4 a1_1;
  vfloat4 b0_1;
  vfloat4 a0_1;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  __m128 c_1;
  __m128 r;
  __m128 a_1;
  __m128 c_3;
  __m128 r_1;
  __m128 a_3;
  __m128 c_5;
  __m128 r_2;
  __m128 a_5;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_2;
  vfloat4 b_1;
  vfloat4 a_2;
  vfloat4 c_4;
  vfloat4 b_2;
  vfloat4 a_4;
  bool local_1aa9;
  bool local_1a89;
  ulong local_1a28;
  undefined8 uStack_1a20;
  undefined1 local_1a18 [16];
  undefined1 local_1a08 [16];
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  ulong local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  ulong local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  ulong local_19a8;
  undefined8 uStack_19a0;
  undefined1 (*local_1990) [16];
  undefined8 *local_1988;
  undefined8 *local_1968;
  undefined8 *local_1960;
  undefined8 *local_1948;
  ulong *local_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 *local_1928;
  undefined8 *local_1920;
  undefined8 *local_1918;
  ulong *local_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 *local_18f8;
  undefined8 *local_18f0;
  undefined8 *local_18e8;
  ulong *local_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 *local_18c8;
  undefined8 *local_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined1 local_1858 [16];
  undefined8 local_1848;
  undefined8 uStack_1840;
  ulong local_1838;
  undefined8 uStack_1830;
  ulong *local_1820;
  ulong *local_1818;
  undefined8 *local_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined1 local_17d8 [16];
  ulong local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined1 local_17a8 [16];
  undefined8 local_1798;
  undefined8 uStack_1790;
  ulong local_1788;
  undefined8 uStack_1780;
  ulong *local_1778;
  undefined1 (*local_1770) [16];
  undefined8 *local_1768;
  ulong *local_1760;
  ulong *local_1758;
  ulong *local_1750;
  ulong *local_1748;
  ulong *local_1740;
  ulong *local_1738;
  ulong *local_1730;
  undefined1 *local_1728;
  ulong *local_1720;
  undefined1 *local_1718;
  ulong *local_1708;
  Vector *local_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  float local_16cc;
  undefined8 *local_16c8;
  ulong *local_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  float local_169c;
  undefined8 *local_1698;
  ulong *local_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  float local_166c;
  undefined8 *local_1668;
  ulong *local_1660;
  ulong local_1658;
  undefined8 uStack_1650;
  undefined1 local_1648 [16];
  ulong local_1638;
  undefined8 uStack_1630;
  float local_161c;
  ulong local_1618;
  undefined8 uStack_1610;
  undefined1 local_1608 [16];
  ulong local_15f8;
  undefined8 uStack_15f0;
  float local_15dc;
  ulong local_15d8;
  undefined8 uStack_15d0;
  undefined1 local_15c8 [16];
  ulong local_15b8;
  undefined8 uStack_15b0;
  float local_159c;
  undefined8 *local_1598;
  undefined8 *local_1590;
  ulong *local_1588;
  undefined8 *local_1580;
  undefined8 *local_1578;
  ulong *local_1570;
  undefined8 *local_1568;
  undefined8 *local_1560;
  ulong *local_1558;
  undefined8 *local_1550;
  undefined8 *local_1548;
  undefined8 *local_1540;
  undefined8 *local_1538;
  undefined8 *local_1530;
  undefined8 *local_1528;
  undefined8 *local_1520;
  undefined8 *local_1518;
  undefined8 *local_1510;
  float local_1504;
  undefined8 *local_1500;
  float local_14f4;
  undefined8 *local_14f0;
  float local_14e4;
  undefined8 *local_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  float local_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  undefined8 *local_1400;
  float local_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  undefined8 *local_13e0;
  float local_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  undefined8 *local_13c0;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  ulong *local_13a0;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  ulong *local_1380;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  ulong *local_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 *local_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 *local_1320;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  undefined8 *local_1300;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float local_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_127c;
  undefined1 local_1278 [16];
  undefined4 local_125c;
  undefined1 local_1258 [16];
  undefined4 local_123c;
  undefined1 local_1238 [16];
  float local_121c;
  undefined1 local_1218 [16];
  undefined4 local_11fc;
  undefined1 local_11f8 [16];
  undefined4 local_11dc;
  undefined1 local_11d8 [16];
  float local_11bc;
  undefined1 local_11b8 [16];
  undefined4 local_119c;
  undefined1 local_1198 [16];
  undefined4 local_117c;
  undefined1 local_1178 [16];
  float local_115c;
  ulong local_1158;
  undefined8 uStack_1150;
  ulong local_1148;
  undefined8 uStack_1140;
  ulong local_1138;
  undefined8 uStack_1130;
  ulong local_1128;
  undefined8 uStack_1120;
  ulong local_1118;
  undefined8 uStack_1110;
  ulong local_1108;
  undefined8 uStack_1100;
  ulong local_10f8;
  undefined8 uStack_10f0;
  ulong local_10e8;
  undefined8 uStack_10e0;
  ulong local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  ulong local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  ulong local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  ulong local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  ulong local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  ulong local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  ulong local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  ulong local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  ulong local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  ulong local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  ulong local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  ulong local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  ulong local_ef8;
  undefined8 uStack_ef0;
  ulong local_ee8;
  undefined8 uStack_ee0;
  ulong local_ed8;
  undefined8 uStack_ed0;
  ulong local_ec8;
  undefined8 uStack_ec0;
  undefined1 *local_ea0;
  ulong local_e98;
  undefined8 uStack_e90;
  ulong *local_e80;
  undefined1 *local_e60;
  ulong local_e58;
  undefined8 uStack_e50;
  ulong *local_e40;
  undefined1 *local_e20;
  undefined1 *local_e00;
  undefined1 *local_de0;
  ulong local_dd8;
  undefined8 uStack_dd0;
  ulong *local_dc0;
  undefined8 *local_db8;
  undefined8 *local_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 *local_d90;
  ulong *local_d88;
  undefined8 *local_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 *local_d60;
  undefined1 *local_d58;
  undefined8 *local_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 *local_d30;
  undefined8 *local_d28;
  undefined8 *local_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 *local_d00;
  undefined1 *local_cf8;
  undefined8 *local_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 *local_cd0;
  undefined1 *local_cc8;
  undefined8 *local_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 *local_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  ulong *local_c78;
  undefined8 *local_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 *local_c50;
  undefined8 *local_c48;
  ulong *local_c40;
  undefined8 *local_c38;
  undefined8 *local_c30;
  ulong *local_c28;
  undefined8 *local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  ulong local_c08;
  undefined8 uStack_c00;
  float local_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  undefined8 *local_be8;
  undefined8 *local_be0;
  ulong *local_bd8;
  undefined8 *local_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  undefined8 *local_b98;
  undefined1 *local_b90;
  undefined8 *local_b88;
  undefined8 *local_b80;
  float fStack_b74;
  float fStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  undefined8 *local_b48;
  undefined1 *local_b40;
  undefined8 *local_b38;
  undefined8 *local_b30;
  float fStack_b24;
  float fStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  undefined8 *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined8 local_a48;
  undefined8 uStack_a40;
  ulong local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined1 *local_a00;
  undefined8 *local_9f8;
  undefined1 *local_9f0;
  undefined8 *local_9e8;
  undefined8 *local_9e0;
  ulong *local_9d8;
  undefined8 *local_9d0;
  ulong *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  undefined8 *local_9b0;
  undefined1 *local_9a8;
  ulong *local_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  undefined8 *local_988;
  undefined8 *local_980;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 *local_958;
  undefined8 *local_950;
  undefined8 *local_948;
  undefined8 *local_940;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  ulong *local_8a0;
  Vector *local_888;
  Vector *local_880;
  undefined1 *local_878;
  Vector *local_870;
  undefined1 *local_868;
  Vector *local_860;
  ulong *local_858;
  Vector *local_838;
  Vector *local_830;
  Vector *local_828;
  Vector *local_820;
  Vector *local_808;
  Vector *local_800;
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  int local_7e8;
  int iStack_7e4;
  int iStack_7e0;
  int iStack_7dc;
  int local_7d8;
  int iStack_7d4;
  int iStack_7d0;
  int iStack_7cc;
  int local_7c8;
  int iStack_7c4;
  int iStack_7c0;
  int iStack_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 *local_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 *local_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 *local_8;
  
  local_1988 = in_RSI + 2;
  local_1990 = (undefined1 (*) [16])(in_RSI + 4);
  local_1960 = &local_19b8;
  uVar1 = *local_1988;
  uVar2 = in_RSI[3];
  uVar3 = *in_RSI;
  uVar4 = in_RSI[1];
  local_8b8._0_4_ = (float)uVar1;
  local_8b8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_8b0._0_4_ = (float)uVar2;
  uStack_8b0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_8c8._0_4_ = (float)uVar3;
  local_8c8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_8c0._0_4_ = (float)uVar4;
  uStack_8c0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_1318 = (float)local_8b8 - (float)local_8c8;
  fStack_1314 = local_8b8._4_4_ - local_8c8._4_4_;
  fStack_1310 = (float)uStack_8b0 - (float)uStack_8c0;
  fStack_130c = uStack_8b0._4_4_ - uStack_8c0._4_4_;
  local_1498 = CONCAT44(fStack_1314,local_1318);
  uStack_1490 = CONCAT44(fStack_130c,fStack_1310);
  local_18e0 = &local_19a8;
  local_1540 = &local_18d8;
  local_13d8 = local_1318 * local_1318;
  fStack_13d4 = fStack_1314 * fStack_1314;
  fStack_13d0 = fStack_1310 * fStack_1310;
  fStack_13cc = fStack_130c * fStack_130c;
  local_678 = CONCAT44(fStack_13d4,local_13d8);
  uStack_670 = CONCAT44(fStack_13cc,fStack_13d0);
  local_668 = &local_6a8;
  local_508 = &local_6b8;
  local_258 = CONCAT44(fStack_13d4,fStack_13d4);
  uStack_250 = CONCAT44(fStack_13d4,fStack_13d4);
  local_4d8 = &local_6c8;
  local_2c8 = CONCAT44(fStack_13d0,fStack_13d0);
  uStack_2c0 = CONCAT44(fStack_13d0,fStack_13d0);
  local_308 = &local_6e8;
  local_288 = local_13d8 + fStack_13d4;
  fStack_284 = fStack_13d4 + fStack_13d4;
  fStack_280 = fStack_13d0 + fStack_13d4;
  fStack_27c = fStack_13cc + fStack_13d4;
  local_2b8 = CONCAT44(fStack_284,local_288);
  uStack_2b0 = CONCAT44(fStack_27c,fStack_280);
  local_660 = &local_6d8;
  local_161c = local_288 + fStack_13d0;
  fStack_2f4 = fStack_284 + fStack_13d0;
  fStack_2f0 = fStack_280 + fStack_13d0;
  fStack_2ec = fStack_27c + fStack_13d0;
  local_688 = CONCAT44(fStack_2f4,local_161c);
  uStack_680 = CONCAT44(fStack_2ec,fStack_2f0);
  local_1178 = ZEXT416((uint)local_161c);
  local_1638 = CONCAT44(0,local_161c);
  uStack_1630 = 0;
  uStack_1130 = 0;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_1638;
  local_1648 = rsqrtss(auVar16,auVar16);
  local_117c = 0x3fc00000;
  local_1198 = ZEXT416(0x3fc00000);
  local_f08 = local_1648._0_8_;
  uVar28 = local_f08;
  uStack_f00 = local_1648._8_8_;
  local_f08._0_4_ = local_1648._0_4_;
  local_ef8 = (ulong)(uint)((float)local_f08 * 1.5);
  uStack_ef0 = 0;
  local_119c = 0xbf000000;
  local_11b8 = ZEXT416(0xbf000000);
  local_f28 = local_11b8._0_8_;
  uStack_f20 = 0;
  local_f18 = (ulong)(uint)(local_161c * -0.5);
  uStack_f10 = 0;
  local_f48 = local_1648._0_8_;
  uStack_f40 = local_1648._8_8_;
  local_16cc = local_161c * -0.5 * (float)local_f08;
  local_f38 = (ulong)(uint)local_16cc;
  uStack_f30 = 0;
  local_f68 = local_1648._0_8_;
  uStack_f60 = local_1648._8_8_;
  local_f58 = CONCAT44(local_1648._4_4_,(float)local_f08 * (float)local_f08);
  uStack_f50 = local_1648._8_8_;
  local_f88 = local_f58;
  uStack_f80 = local_1648._8_8_;
  local_16cc = local_16cc * (float)local_f08 * (float)local_f08;
  local_f78 = (ulong)(uint)local_16cc;
  uStack_f70 = 0;
  local_10e8 = local_f78;
  uStack_10e0 = 0;
  local_16cc = (float)local_f08 * 1.5 + local_16cc;
  local_10d8 = (ulong)(uint)local_16cc;
  uStack_10d0 = 0;
  local_1658 = local_10d8;
  uStack_1650 = 0;
  local_ec8 = local_10d8;
  uStack_ec0 = 0;
  local_1568 = &local_16e8;
  local_1478 = CONCAT44(local_16cc,local_16cc);
  uStack_1470 = CONCAT44(local_16cc,local_16cc);
  local_13b8 = local_1318 * local_16cc;
  fStack_13b4 = fStack_1314 * local_16cc;
  fStack_13b0 = fStack_1310 * local_16cc;
  fStack_13ac = fStack_130c * local_16cc;
  local_dd8 = CONCAT44(fStack_13b4,local_13b8);
  uStack_dd0 = CONCAT44(fStack_13ac,fStack_13b0);
  local_1918 = &local_19d8;
  local_e58 = *(ulong *)*local_1990;
  uStack_e50 = in_RSI[5];
  local_e40 = &local_1788;
  auVar24._8_8_ = uStack_19a0;
  auVar24._0_8_ = local_19a8;
  local_e60 = local_17a8;
  local_d50 = &local_1798;
  fStack_b00 = (float)local_19a8;
  auVar30._12_4_ = (float)((ulong)uStack_19a0 >> 0x20);
  auVar30._0_8_ = auVar24._4_8_;
  auVar30._8_4_ = fStack_b00;
  local_aa8._8_8_ = auVar30._8_8_;
  uStack_d40 = local_aa8._8_8_;
  uStack_1790 = local_aa8._8_8_;
  local_e98 = *(ulong *)*local_1990;
  uStack_e90 = in_RSI[5];
  auVar14 = *local_1990;
  local_e80 = &local_17c8;
  local_d80 = &local_17b8;
  auVar31._12_4_ = (float)((ulong)uStack_e90 >> 0x20);
  auVar31._0_8_ = auVar14._4_8_;
  auVar31._8_4_ = (float)local_e98;
  local_a98._8_8_ = auVar31._8_8_;
  uStack_d70 = local_a98._8_8_;
  uStack_17b0 = local_a98._8_8_;
  local_ea0 = local_17d8;
  local_c88 = &local_1808;
  uStack_b60 = local_a98._8_8_;
  local_b68._0_4_ = auVar14._4_4_;
  local_b68._4_4_ = auVar14._8_4_;
  fStack_b74 = (float)(local_19a8 >> 0x20);
  fStack_b70 = (float)uStack_19a0;
  local_b58 = (float)local_b68 * fStack_b00;
  fStack_b54 = local_b68._4_4_ * fStack_b74;
  fStack_b50 = (float)local_e98 * fStack_b70;
  fStack_b4c = auVar31._12_4_ * auVar30._12_4_;
  local_db8 = &local_17f8;
  local_bd0 = &local_c98;
  uStack_bc0 = local_aa8._8_8_;
  local_bb8._0_4_ = (float)local_e58;
  local_bb8._4_4_ = (float)(local_e58 >> 0x20);
  uStack_bb0._0_4_ = (float)uStack_e50;
  uStack_bb0._4_4_ = (float)((ulong)uStack_e50 >> 0x20);
  local_ba8 = (float)local_bb8 * fStack_b74;
  fStack_ba4 = local_bb8._4_4_ * fStack_b70;
  fStack_ba0 = (float)uStack_bb0 * fStack_b00;
  fStack_b9c = uStack_bb0._4_4_ * auVar30._12_4_;
  local_8f8 = CONCAT44(fStack_ba4,local_ba8);
  uStack_8f0 = CONCAT44(fStack_b9c,fStack_ba0);
  local_908 = (float)local_1808;
  fStack_904 = (float)((ulong)local_1808 >> 0x20);
  fStack_900 = (float)uStack_1800;
  fStack_8fc = (float)((ulong)uStack_1800 >> 0x20);
  local_938 = local_ba8 - local_908;
  fStack_934 = fStack_ba4 - fStack_904;
  fStack_930 = fStack_ba0 - fStack_900;
  auVar32._12_4_ = fStack_b9c - fStack_8fc;
  local_a18 = CONCAT44(fStack_934,local_938);
  uStack_a10 = CONCAT44(auVar32._12_4_,fStack_930);
  local_db0 = &local_17e8;
  auVar22._8_8_ = uStack_a10;
  auVar22._0_8_ = local_a18;
  auVar32._0_8_ = auVar22._4_8_;
  auVar32._8_4_ = local_938;
  local_a88._8_8_ = auVar32._8_8_;
  uStack_da0 = local_a88._8_8_;
  uStack_17e0 = local_a88._8_8_;
  uStack_1350 = local_a88._8_8_;
  uStack_19d0 = local_a88._8_8_;
  local_1910 = &local_19c8;
  local_1528 = &local_1908;
  uStack_14a0 = local_a88._8_8_;
  uStack_14b0 = local_a88._8_8_;
  local_13f8 = fStack_934 * fStack_934;
  fStack_13f4 = fStack_930 * fStack_930;
  fStack_13f0 = local_938 * local_938;
  fStack_13ec = auVar32._12_4_ * auVar32._12_4_;
  local_5e8 = CONCAT44(fStack_13f4,local_13f8);
  uStack_5e0 = CONCAT44(fStack_13ec,fStack_13f0);
  local_5d8 = &local_618;
  local_518 = &local_628;
  local_338 = CONCAT44(fStack_13f4,fStack_13f4);
  uStack_330 = CONCAT44(fStack_13f4,fStack_13f4);
  local_4e8 = &local_638;
  local_3a8 = CONCAT44(fStack_13f0,fStack_13f0);
  uStack_3a0 = CONCAT44(fStack_13f0,fStack_13f0);
  local_3e8 = &local_658;
  local_368 = local_13f8 + fStack_13f4;
  fStack_364 = fStack_13f4 + fStack_13f4;
  fStack_360 = fStack_13f0 + fStack_13f4;
  fStack_35c = fStack_13ec + fStack_13f4;
  local_398 = CONCAT44(fStack_364,local_368);
  uStack_390 = CONCAT44(fStack_35c,fStack_360);
  local_5d0 = &local_648;
  local_15dc = local_368 + fStack_13f0;
  fStack_3d4 = fStack_364 + fStack_13f0;
  fStack_3d0 = fStack_360 + fStack_13f0;
  fStack_3cc = fStack_35c + fStack_13f0;
  local_5f8 = CONCAT44(fStack_3d4,local_15dc);
  uStack_5f0 = CONCAT44(fStack_3cc,fStack_3d0);
  local_11d8 = ZEXT416((uint)local_15dc);
  local_15f8 = CONCAT44(0,local_15dc);
  uStack_15f0 = 0;
  uStack_1140 = 0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_15f8;
  local_1608 = rsqrtss(auVar15,auVar15);
  local_11dc = 0x3fc00000;
  local_11f8 = ZEXT416(0x3fc00000);
  local_fa8 = local_1608._0_8_;
  uVar27 = local_fa8;
  uStack_fa0 = local_1608._8_8_;
  local_fa8._0_4_ = local_1608._0_4_;
  local_f98 = (ulong)(uint)((float)local_fa8 * 1.5);
  uStack_f90 = 0;
  local_11fc = 0xbf000000;
  local_1218 = ZEXT416(0xbf000000);
  local_fc8 = local_1218._0_8_;
  uStack_fc0 = 0;
  local_fb8 = (ulong)(uint)(local_15dc * -0.5);
  uStack_fb0 = 0;
  local_fe8 = local_1608._0_8_;
  uStack_fe0 = local_1608._8_8_;
  local_169c = local_15dc * -0.5 * (float)local_fa8;
  local_fd8 = (ulong)(uint)local_169c;
  uStack_fd0 = 0;
  local_1008 = local_1608._0_8_;
  uStack_1000 = local_1608._8_8_;
  local_ff8 = CONCAT44(local_1608._4_4_,(float)local_fa8 * (float)local_fa8);
  uStack_ff0 = local_1608._8_8_;
  local_1028 = local_ff8;
  uStack_1020 = local_1608._8_8_;
  local_169c = local_169c * (float)local_fa8 * (float)local_fa8;
  local_1018 = (ulong)(uint)local_169c;
  uStack_1010 = 0;
  local_1108 = local_1018;
  uStack_1100 = 0;
  local_169c = (float)local_fa8 * 1.5 + local_169c;
  local_10f8 = (ulong)(uint)local_169c;
  uStack_10f0 = 0;
  local_1618 = local_10f8;
  uStack_1610 = 0;
  local_ed8 = local_10f8;
  uStack_ed0 = 0;
  local_1580 = &local_16b8;
  local_1458 = CONCAT44(local_169c,local_169c);
  uStack_1450 = CONCAT44(local_169c,local_169c);
  uStack_1440 = local_a88._8_8_;
  local_1398 = fStack_934 * local_169c;
  fStack_1394 = fStack_930 * local_169c;
  fStack_1390 = local_938 * local_169c;
  fStack_138c = auVar32._12_4_ * local_169c;
  local_1a28 = CONCAT44(fStack_1394,local_1398);
  uStack_1a20 = CONCAT44(fStack_138c,fStack_1390);
  local_1948 = &local_19f8;
  local_dc0 = &local_1838;
  auVar23._8_8_ = uStack_19c0;
  auVar23._0_8_ = local_19c8;
  local_de0 = local_1858;
  local_cc0 = &local_1848;
  fStack_bf0 = (float)local_19c8;
  auVar33._12_4_ = (float)((ulong)uStack_19c0 >> 0x20);
  auVar33._0_8_ = auVar23._4_8_;
  auVar33._8_4_ = fStack_bf0;
  local_ad8._8_8_ = auVar33._8_8_;
  uStack_cb0 = local_ad8._8_8_;
  uStack_1840 = local_ad8._8_8_;
  auVar25._8_8_ = uStack_19a0;
  auVar25._0_8_ = local_19a8;
  local_e00 = local_1878;
  local_cf0 = &local_1868;
  local_ac8._0_8_ = auVar25._4_8_;
  local_ac8._8_4_ = fStack_b00;
  local_ac8._12_4_ = auVar30._12_4_;
  uStack_ce0 = local_ac8._8_8_;
  uStack_1860 = local_ac8._8_8_;
  local_e20 = local_1888;
  local_c50 = &local_18b8;
  uStack_b10 = local_ac8._8_8_;
  fStack_b24 = (float)(local_19c8 >> 0x20);
  fStack_b20 = (float)uStack_19c0;
  local_b08 = fStack_b74 * fStack_bf0;
  fStack_b04 = fStack_b70 * fStack_b24;
  fStack_b00 = fStack_b00 * fStack_b20;
  fStack_afc = auVar30._12_4_ * auVar33._12_4_;
  local_d28 = &local_18a8;
  local_c20 = &local_c68;
  uStack_c10 = local_ad8._8_8_;
  local_bf8 = local_13b8 * fStack_b24;
  fStack_bf4 = fStack_13b4 * fStack_b20;
  fStack_bf0 = fStack_13b0 * fStack_bf0;
  fStack_bec = fStack_13ac * auVar33._12_4_;
  local_8d8 = CONCAT44(fStack_bf4,local_bf8);
  uStack_8d0 = CONCAT44(fStack_bec,fStack_bf0);
  local_8e8 = (float)local_18b8;
  fStack_8e4 = (float)((ulong)local_18b8 >> 0x20);
  fStack_8e0 = (float)uStack_18b0;
  fStack_8dc = (float)((ulong)uStack_18b0 >> 0x20);
  local_978 = local_bf8 - local_8e8;
  fStack_974 = fStack_bf4 - fStack_8e4;
  fStack_970 = fStack_bf0 - fStack_8e0;
  auVar34._12_4_ = fStack_bec - fStack_8dc;
  local_a48 = CONCAT44(fStack_974,local_978);
  uStack_a40 = CONCAT44(auVar34._12_4_,fStack_970);
  local_d20 = &local_1898;
  auVar21._8_8_ = uStack_a40;
  auVar21._0_8_ = local_a48;
  auVar34._0_8_ = auVar21._4_8_;
  auVar34._8_4_ = local_978;
  local_ab8._8_8_ = auVar34._8_8_;
  uStack_d10 = local_ab8._8_8_;
  uStack_1890 = local_ab8._8_8_;
  uStack_1330 = local_ab8._8_8_;
  uStack_19f0 = local_ab8._8_8_;
  local_1940 = &local_19e8;
  local_1510 = &local_1938;
  uStack_14c0 = local_ab8._8_8_;
  uStack_14d0 = local_ab8._8_8_;
  local_1418 = fStack_974 * fStack_974;
  fStack_1414 = fStack_970 * fStack_970;
  fStack_1410 = local_978 * local_978;
  fStack_140c = auVar34._12_4_ * auVar34._12_4_;
  local_558 = CONCAT44(fStack_1414,local_1418);
  uStack_550 = CONCAT44(fStack_140c,fStack_1410);
  local_540 = &local_588;
  local_528 = &local_598;
  local_418 = CONCAT44(fStack_1414,fStack_1414);
  uStack_410 = CONCAT44(fStack_1414,fStack_1414);
  local_4f8 = &local_5a8;
  local_488 = CONCAT44(fStack_1410,fStack_1410);
  uStack_480 = CONCAT44(fStack_1410,fStack_1410);
  local_4c8 = &local_5c8;
  local_448 = local_1418 + fStack_1414;
  fStack_444 = fStack_1414 + fStack_1414;
  fStack_440 = fStack_1410 + fStack_1414;
  fStack_43c = fStack_140c + fStack_1414;
  local_478 = CONCAT44(fStack_444,local_448);
  uStack_470 = CONCAT44(fStack_43c,fStack_440);
  local_538 = &local_5b8;
  local_159c = local_448 + fStack_1410;
  fStack_4b4 = fStack_444 + fStack_1410;
  fStack_4b0 = fStack_440 + fStack_1410;
  fStack_4ac = fStack_43c + fStack_1410;
  local_568 = CONCAT44(fStack_4b4,local_159c);
  uStack_560 = CONCAT44(fStack_4ac,fStack_4b0);
  local_1238 = ZEXT416((uint)local_159c);
  local_15b8 = CONCAT44(0,local_159c);
  uStack_15b0 = 0;
  uStack_1150 = 0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_15b8;
  local_15c8 = rsqrtss(auVar14,auVar14);
  local_123c = 0x3fc00000;
  local_1258 = ZEXT416(0x3fc00000);
  local_1048 = local_15c8._0_8_;
  uVar26 = local_1048;
  uStack_1040 = local_15c8._8_8_;
  local_1048._0_4_ = local_15c8._0_4_;
  local_1038 = (ulong)(uint)((float)local_1048 * 1.5);
  uStack_1030 = 0;
  local_125c = 0xbf000000;
  local_1278 = ZEXT416(0xbf000000);
  local_1068 = local_1278._0_8_;
  uStack_1060 = 0;
  local_1058 = (ulong)(uint)(local_159c * -0.5);
  uStack_1050 = 0;
  local_1088 = local_15c8._0_8_;
  uStack_1080 = local_15c8._8_8_;
  local_166c = local_159c * -0.5 * (float)local_1048;
  local_1078 = (ulong)(uint)local_166c;
  uStack_1070 = 0;
  local_10a8 = local_15c8._0_8_;
  uStack_10a0 = local_15c8._8_8_;
  local_1098 = CONCAT44(local_15c8._4_4_,(float)local_1048 * (float)local_1048);
  uStack_1090 = local_15c8._8_8_;
  local_10c8 = local_1098;
  uStack_10c0 = local_15c8._8_8_;
  local_166c = local_166c * (float)local_1048 * (float)local_1048;
  local_10b8 = (ulong)(uint)local_166c;
  uStack_10b0 = 0;
  local_1128 = local_10b8;
  uStack_1120 = 0;
  local_166c = (float)local_1048 * 1.5 + local_166c;
  local_1118 = (ulong)(uint)local_166c;
  uStack_1110 = 0;
  local_15d8 = local_1118;
  uStack_15d0 = 0;
  local_ee8 = local_1118;
  uStack_ee0 = 0;
  local_1598 = &local_1688;
  local_1438 = CONCAT44(local_166c,local_166c);
  uStack_1430 = CONCAT44(local_166c,local_166c);
  uStack_1420 = local_ab8._8_8_;
  local_1378 = fStack_974 * local_166c;
  fStack_1374 = fStack_970 * local_166c;
  fStack_1370 = local_978 * local_166c;
  fStack_136c = auVar34._12_4_ * local_166c;
  local_1748 = &local_1a28;
  local_1728 = local_1a18;
  local_1718 = local_1a08;
  local_888 = &(in_RDI->l).vy;
  local_880 = &(in_RDI->l).vz;
  *(ulong *)&(in_RDI->l).vx.field_0 = local_1a28;
  *(undefined8 *)((long)&(in_RDI->l).vx.field_0 + 8) = uStack_1a20;
  local_868 = local_1a18;
  *(ulong *)&local_888->field_0 = local_19e8;
  *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uStack_19e0;
  local_878 = local_1a08;
  *(ulong *)&local_880->field_0 = local_19a8;
  *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uStack_19a0;
  local_16f0 = &in_RDI->p;
  uVar5 = in_RSI[1];
  *(undefined8 *)&local_16f0->field_0 = *in_RSI;
  *(undefined8 *)((long)&(in_RDI->p).field_0 + 8) = uVar5;
  uVar5 = *(undefined8 *)&(in_RDI->l).vx.field_0;
  uVar6 = *(undefined8 *)((long)&(in_RDI->l).vx.field_0 + 8);
  uVar7 = *(undefined8 *)&(in_RDI->l).vx.field_0;
  uVar8 = *(undefined8 *)((long)&(in_RDI->l).vx.field_0 + 8);
  local_788._0_4_ = (float)uVar5;
  local_788._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_780._0_4_ = (float)uVar6;
  uStack_780._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_798._0_4_ = (float)uVar7;
  local_798._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_790._0_4_ = (float)uVar8;
  uStack_790._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_7e8 = -(uint)((float)local_788 == (float)local_798);
  iStack_7e4 = -(uint)(local_788._4_4_ == local_798._4_4_);
  iStack_7e0 = -(uint)((float)uStack_780 == (float)uStack_790);
  iStack_7dc = -(uint)(uStack_780._4_4_ == uStack_790._4_4_);
  auVar18._4_4_ = iStack_7e4;
  auVar18._0_4_ = local_7e8;
  auVar18._8_4_ = iStack_7e0;
  auVar18._12_4_ = iStack_7dc;
  uVar29 = movmskps((int)in_RDI,auVar18);
  local_1a89 = false;
  if ((uVar29 & 7) == 7) {
    local_820 = &(in_RDI->l).vy;
    local_828 = &(in_RDI->l).vy;
    uVar9 = *(undefined8 *)&local_820->field_0;
    uVar10 = *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8);
    uVar11 = *(undefined8 *)&local_828->field_0;
    uVar12 = *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8);
    local_768._0_4_ = (float)uVar9;
    local_768._4_4_ = (float)((ulong)uVar9 >> 0x20);
    uStack_760._0_4_ = (float)uVar10;
    uStack_760._4_4_ = (float)((ulong)uVar10 >> 0x20);
    local_778._0_4_ = (float)uVar11;
    local_778._4_4_ = (float)((ulong)uVar11 >> 0x20);
    uStack_770._0_4_ = (float)uVar12;
    uStack_770._4_4_ = (float)((ulong)uVar12 >> 0x20);
    local_7d8 = -(uint)((float)local_768 == (float)local_778);
    iStack_7d4 = -(uint)(local_768._4_4_ == local_778._4_4_);
    iStack_7d0 = -(uint)((float)uStack_760 == (float)uStack_770);
    iStack_7cc = -(uint)(uStack_760._4_4_ == uStack_770._4_4_);
    auVar19._4_4_ = iStack_7d4;
    auVar19._0_4_ = local_7d8;
    auVar19._8_4_ = iStack_7d0;
    auVar19._12_4_ = iStack_7cc;
    uVar29 = movmskps((int)local_820,auVar19);
    local_1a89 = false;
    local_778 = uVar11;
    uStack_770 = uVar12;
    local_768 = uVar9;
    uStack_760 = uVar10;
    if ((uVar29 & 7) == 7) {
      local_830 = &(in_RDI->l).vz;
      local_838 = &(in_RDI->l).vz;
      uVar9 = *(undefined8 *)&local_830->field_0;
      uVar10 = *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8);
      uVar11 = *(undefined8 *)&local_838->field_0;
      uVar12 = *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8);
      local_748._0_4_ = (float)uVar9;
      local_748._4_4_ = (float)((ulong)uVar9 >> 0x20);
      uStack_740._0_4_ = (float)uVar10;
      uStack_740._4_4_ = (float)((ulong)uVar10 >> 0x20);
      local_758._0_4_ = (float)uVar11;
      local_758._4_4_ = (float)((ulong)uVar11 >> 0x20);
      uStack_750._0_4_ = (float)uVar12;
      uStack_750._4_4_ = (float)((ulong)uVar12 >> 0x20);
      local_7c8 = -(uint)((float)local_748 == (float)local_758);
      iStack_7c4 = -(uint)(local_748._4_4_ == local_758._4_4_);
      iStack_7c0 = -(uint)((float)uStack_740 == (float)uStack_750);
      iStack_7bc = -(uint)(uStack_740._4_4_ == uStack_750._4_4_);
      auVar20._4_4_ = iStack_7c4;
      auVar20._0_4_ = local_7c8;
      auVar20._8_4_ = iStack_7c0;
      auVar20._12_4_ = iStack_7bc;
      uVar29 = movmskps((int)local_838,auVar20);
      local_1a89 = (uVar29 & 7) == 7;
      local_758 = uVar11;
      uStack_750 = uVar12;
      local_748 = uVar9;
      uStack_740 = uVar10;
    }
  }
  local_1aa9 = false;
  if (local_1a89) {
    local_800 = &in_RDI->p;
    local_808 = &in_RDI->p;
    uVar9 = *(undefined8 *)&local_800->field_0;
    uVar10 = *(undefined8 *)((long)&(in_RDI->p).field_0 + 8);
    uVar11 = *(undefined8 *)&local_808->field_0;
    uVar12 = *(undefined8 *)((long)&(in_RDI->p).field_0 + 8);
    local_7a8._0_4_ = (float)uVar9;
    local_7a8._4_4_ = (float)((ulong)uVar9 >> 0x20);
    uStack_7a0._0_4_ = (float)uVar10;
    uStack_7a0._4_4_ = (float)((ulong)uVar10 >> 0x20);
    local_7b8._0_4_ = (float)uVar11;
    local_7b8._4_4_ = (float)((ulong)uVar11 >> 0x20);
    uStack_7b0._0_4_ = (float)uVar12;
    uStack_7b0._4_4_ = (float)((ulong)uVar12 >> 0x20);
    local_7f8 = -(uint)((float)local_7a8 == (float)local_7b8);
    iStack_7f4 = -(uint)(local_7a8._4_4_ == local_7b8._4_4_);
    iStack_7f0 = -(uint)((float)uStack_7a0 == (float)uStack_7b0);
    iStack_7ec = -(uint)(uStack_7a0._4_4_ == uStack_7b0._4_4_);
    auVar17._4_4_ = iStack_7f4;
    auVar17._0_4_ = local_7f8;
    auVar17._8_4_ = iStack_7f0;
    auVar17._12_4_ = iStack_7ec;
    uVar29 = movmskps((int)local_808,auVar17);
    local_1aa9 = (uVar29 & 7) == 7;
    local_7b8 = uVar11;
    uStack_7b0 = uVar12;
    local_7a8 = uVar9;
    uStack_7a0 = uVar10;
  }
  if (local_1aa9) {
    if (*(int *)((long)in_RSI + 0x34) == 1) {
      uVar13 = *(ulong *)((long)&(in_RDI->l).vx.field_0 + 8);
      *(ulong *)&(in_RDI->l).vx.field_0 = *(ulong *)&(in_RDI->l).vx.field_0 ^ 0x8000000080000000;
      *(ulong *)((long)&(in_RDI->l).vx.field_0 + 8) = uVar13 ^ 0x8000000080000000;
    }
    return in_RDI;
  }
  local_1968 = local_1988;
  local_1928 = local_1948;
  local_1920 = local_1948;
  local_18f8 = local_1918;
  local_18f0 = local_1918;
  local_18e8 = local_1960;
  local_18c8 = local_1960;
  local_18c0 = local_1960;
  local_1820 = local_1910;
  local_1818 = local_18e0;
  local_1810 = local_1948;
  local_1778 = local_18e0;
  local_1770 = local_1990;
  local_1768 = local_1918;
  local_1760 = local_18e0;
  local_1758 = local_1940;
  local_1750 = local_1910;
  local_1740 = local_1910;
  local_1738 = local_1748;
  local_1730 = local_1940;
  local_1720 = local_18e0;
  local_1708 = local_1748;
  local_16c8 = local_1960;
  local_16c0 = local_18e0;
  local_1698 = local_1918;
  local_1690 = local_1910;
  local_1668 = local_1948;
  local_1660 = local_1940;
  local_1590 = local_1948;
  local_1588 = local_1940;
  local_1578 = local_1918;
  local_1570 = local_1910;
  local_1560 = local_1960;
  local_1558 = local_18e0;
  local_1550 = local_1960;
  local_1548 = local_1960;
  local_1538 = local_1918;
  local_1530 = local_1918;
  local_1520 = local_1948;
  local_1518 = local_1948;
  local_1504 = local_166c;
  local_1500 = local_1598;
  local_14f4 = local_169c;
  local_14f0 = local_1580;
  local_14e4 = local_16cc;
  local_14e0 = local_1568;
  local_14d8 = auVar34._0_8_;
  local_14c8 = auVar34._0_8_;
  local_14b8 = auVar32._0_8_;
  local_14a8 = auVar32._0_8_;
  local_1488 = local_1498;
  uStack_1480 = uStack_1490;
  local_1468 = local_1498;
  uStack_1460 = uStack_1490;
  local_1448 = auVar32._0_8_;
  local_1428 = auVar34._0_8_;
  local_1400 = local_1510;
  local_13e0 = local_1528;
  local_13c0 = local_1540;
  local_13a0 = local_18e0;
  local_1380 = local_1910;
  local_1360 = local_1940;
  local_1358 = auVar32._0_8_;
  local_1340 = local_1918;
  local_1338 = auVar34._0_8_;
  local_1320 = local_1948;
  local_1300 = local_1960;
  local_12d8 = local_16cc;
  fStack_12d4 = local_16cc;
  fStack_12d0 = local_16cc;
  fStack_12cc = local_16cc;
  local_12bc = local_16cc;
  local_12b8 = local_169c;
  fStack_12b4 = local_169c;
  fStack_12b0 = local_169c;
  fStack_12ac = local_169c;
  local_129c = local_169c;
  local_1298 = local_166c;
  fStack_1294 = local_166c;
  fStack_1290 = local_166c;
  fStack_128c = local_166c;
  local_127c = local_166c;
  local_121c = local_159c;
  local_11bc = local_15dc;
  local_115c = local_161c;
  local_1158 = local_15b8;
  local_1148 = local_15f8;
  local_1138 = local_1638;
  local_1048 = uVar26;
  local_fa8 = uVar27;
  local_f08 = uVar28;
  local_da8 = auVar32._0_8_;
  local_d90 = local_db0;
  local_d88 = local_e80;
  local_d78 = auVar31._0_8_;
  local_d60 = local_d80;
  local_d58 = local_e60;
  local_d48 = auVar30._0_8_;
  local_d30 = local_d50;
  local_d18 = auVar34._0_8_;
  local_d00 = local_d20;
  local_cf8 = local_e00;
  local_ce8 = local_ac8._0_8_;
  local_cd0 = local_cf0;
  local_cc8 = local_de0;
  local_cb8 = auVar33._0_8_;
  local_ca0 = local_cc0;
  local_c80 = local_d50;
  local_c78 = local_e40;
  local_c70 = local_db8;
  local_c48 = local_cc0;
  local_c40 = local_dc0;
  local_c38 = local_d28;
  local_c30 = local_cc0;
  local_c28 = local_dc0;
  local_c18 = auVar33._0_8_;
  local_c08 = local_dd8;
  uStack_c00 = uStack_dd0;
  local_be8 = local_c20;
  local_be0 = local_d50;
  local_bd8 = local_e40;
  local_bc8 = auVar30._0_8_;
  local_bb8 = local_e58;
  uStack_bb0 = uStack_e50;
  local_b98 = local_bd0;
  local_b90 = local_ea0;
  local_b88 = local_d80;
  local_b80 = local_c88;
  local_b68 = auVar31._0_8_;
  local_b48 = local_c88;
  local_b40 = local_e20;
  local_b38 = local_cf0;
  local_b30 = local_c50;
  local_b18 = local_ac8._0_8_;
  local_af0 = local_c50;
  local_ae8 = local_db0;
  local_ae0 = local_d20;
  local_ad8 = auVar33;
  local_ab8 = auVar34;
  local_aa8 = auVar30;
  local_a98 = auVar31;
  local_a88 = auVar32;
  local_a28 = local_e98;
  uStack_a20 = uStack_e90;
  local_a00 = local_e20;
  local_9f8 = local_cf0;
  local_9f0 = local_ea0;
  local_9e8 = local_d80;
  local_9e0 = local_d50;
  local_9d8 = local_e40;
  local_9d0 = local_cc0;
  local_9c8 = local_dc0;
  local_9c0 = local_de0;
  local_9b8 = local_e00;
  local_9b0 = local_d28;
  local_9a8 = local_e60;
  local_9a0 = local_e80;
  local_998 = local_db8;
  local_990 = local_c50;
  local_988 = local_c20;
  local_980 = local_d28;
  fStack_96c = auVar34._12_4_;
  local_968 = local_d28;
  local_960 = local_c50;
  local_958 = local_c20;
  local_950 = local_c88;
  local_948 = local_bd0;
  local_940 = local_db8;
  fStack_92c = auVar32._12_4_;
  local_920 = local_db8;
  local_918 = local_c88;
  local_910 = local_bd0;
  local_8c8 = uVar3;
  uStack_8c0 = uVar4;
  local_8b8 = uVar1;
  uStack_8b0 = uVar2;
  local_8a0 = local_1748;
  local_870 = local_880;
  local_860 = local_888;
  local_858 = local_1748;
  local_798 = uVar7;
  uStack_790 = uVar8;
  local_788 = uVar5;
  uStack_780 = uVar6;
  local_690 = local_1540;
  local_600 = local_1528;
  local_570 = local_1510;
  local_530 = local_540;
  local_520 = local_5d8;
  local_510 = local_668;
  local_500 = local_540;
  local_4f0 = local_5d8;
  local_4e0 = local_668;
  local_4d0 = local_4f8;
  local_4c0 = local_538;
  local_4b8 = local_159c;
  local_4a0 = local_538;
  local_498 = local_4f8;
  local_490 = local_4c8;
  local_460 = local_528;
  local_458 = local_540;
  local_450 = local_4c8;
  local_430 = local_4c8;
  local_428 = local_528;
  local_420 = local_540;
  local_408 = local_558;
  uStack_400 = uStack_550;
  local_3f0 = local_4e8;
  local_3e0 = local_5d0;
  local_3d8 = local_15dc;
  local_3c0 = local_5d0;
  local_3b8 = local_4e8;
  local_3b0 = local_3e8;
  local_380 = local_518;
  local_378 = local_5d8;
  local_370 = local_3e8;
  local_350 = local_3e8;
  local_348 = local_518;
  local_340 = local_5d8;
  local_328 = local_5e8;
  uStack_320 = uStack_5e0;
  local_310 = local_4d8;
  local_300 = local_660;
  local_2f8 = local_161c;
  local_2e0 = local_660;
  local_2d8 = local_4d8;
  local_2d0 = local_308;
  local_2a0 = local_508;
  local_298 = local_668;
  local_290 = local_308;
  local_270 = local_308;
  local_268 = local_508;
  local_260 = local_668;
  local_248 = local_678;
  uStack_240 = uStack_670;
  local_238 = local_668;
  local_230 = local_508;
  local_228 = local_258;
  uStack_220 = uStack_250;
  local_210 = local_508;
  local_208 = fStack_13d4;
  fStack_204 = fStack_13d4;
  fStack_200 = fStack_13d4;
  fStack_1fc = fStack_13d4;
  local_1f8 = local_678;
  uStack_1f0 = uStack_670;
  local_1e0 = local_668;
  local_1d8 = local_5d8;
  local_1d0 = local_518;
  local_1c8 = local_338;
  uStack_1c0 = uStack_330;
  local_1b0 = local_518;
  local_1a8 = fStack_13f4;
  fStack_1a4 = fStack_13f4;
  fStack_1a0 = fStack_13f4;
  fStack_19c = fStack_13f4;
  local_198 = local_5e8;
  uStack_190 = uStack_5e0;
  local_180 = local_5d8;
  local_178 = local_540;
  local_170 = local_528;
  local_168 = local_418;
  uStack_160 = uStack_410;
  local_150 = local_528;
  local_148 = fStack_1414;
  fStack_144 = fStack_1414;
  fStack_140 = fStack_1414;
  fStack_13c = fStack_1414;
  local_138 = local_558;
  uStack_130 = uStack_550;
  local_120 = local_540;
  local_118 = local_668;
  local_110 = local_4d8;
  local_108 = local_2c8;
  uStack_100 = uStack_2c0;
  local_f0 = local_4d8;
  local_e8 = fStack_13d0;
  fStack_e4 = fStack_13d0;
  fStack_e0 = fStack_13d0;
  fStack_dc = fStack_13d0;
  local_d8 = local_678;
  uStack_d0 = uStack_670;
  local_c0 = local_668;
  local_b8 = local_5d8;
  local_b0 = local_4e8;
  local_a8 = local_3a8;
  uStack_a0 = uStack_3a0;
  local_90 = local_4e8;
  local_88 = fStack_13f0;
  fStack_84 = fStack_13f0;
  fStack_80 = fStack_13f0;
  fStack_7c = fStack_13f0;
  local_78 = local_5e8;
  uStack_70 = uStack_5e0;
  local_60 = local_5d8;
  local_58 = local_540;
  local_50 = local_4f8;
  local_48 = local_488;
  uStack_40 = uStack_480;
  local_30 = local_4f8;
  local_28 = fStack_1410;
  fStack_24 = fStack_1410;
  fStack_20 = fStack_1410;
  fStack_1c = fStack_1410;
  local_18 = local_558;
  uStack_10 = uStack_550;
  local_8 = local_540;
  local_19f8 = auVar34._0_8_;
  local_19e8 = CONCAT44(fStack_1374,local_1378);
  uStack_19e0 = CONCAT44(fStack_136c,fStack_1370);
  local_19d8 = auVar32._0_8_;
  local_19c8 = local_1a28;
  uStack_19c0 = uStack_1a20;
  local_19b8 = local_1498;
  uStack_19b0 = uStack_1490;
  local_19a8 = local_dd8;
  uStack_19a0 = uStack_dd0;
  local_1938 = local_558;
  uStack_1930 = uStack_550;
  local_1908 = local_5e8;
  uStack_1900 = uStack_5e0;
  local_18d8 = local_678;
  uStack_18d0 = uStack_670;
  local_18b8 = CONCAT44(fStack_b04,local_b08);
  uStack_18b0 = CONCAT44(fStack_afc,fStack_b00);
  local_18a8 = local_a48;
  uStack_18a0 = uStack_a40;
  local_1898 = auVar34._0_8_;
  local_1868 = local_ac8._0_8_;
  local_1848 = auVar33._0_8_;
  local_1838 = local_dd8;
  uStack_1830 = uStack_dd0;
  local_1808 = CONCAT44(fStack_b54,local_b58);
  uStack_1800 = CONCAT44(fStack_b4c,fStack_b50);
  local_17f8 = local_a18;
  uStack_17f0 = uStack_a10;
  local_17e8 = auVar32._0_8_;
  local_17c8 = local_e98;
  uStack_17c0 = uStack_e90;
  local_17b8 = auVar31._0_8_;
  local_1798 = auVar30._0_8_;
  local_1788 = local_e58;
  uStack_1780 = uStack_e50;
  local_16e8 = local_1478;
  uStack_16e0 = uStack_1470;
  local_16b8 = local_1458;
  uStack_16b0 = uStack_1450;
  local_1688 = local_1438;
  uStack_1680 = uStack_1430;
  local_c98 = local_8f8;
  uStack_c90 = uStack_8f0;
  local_c68 = local_8d8;
  uStack_c60 = uStack_8d0;
  local_6e8 = local_2b8;
  uStack_6e0 = uStack_2b0;
  local_6d8 = local_688;
  uStack_6d0 = uStack_680;
  local_6c8 = local_2c8;
  uStack_6c0 = uStack_2c0;
  local_6b8 = local_258;
  uStack_6b0 = uStack_250;
  local_6a8 = local_678;
  uStack_6a0 = uStack_670;
  local_658 = local_398;
  uStack_650 = uStack_390;
  local_648 = local_5f8;
  uStack_640 = uStack_5f0;
  local_638 = local_3a8;
  uStack_630 = uStack_3a0;
  local_628 = local_338;
  uStack_620 = uStack_330;
  local_618 = local_5e8;
  uStack_610 = uStack_5e0;
  local_5c8 = local_478;
  uStack_5c0 = uStack_470;
  local_5b8 = local_568;
  uStack_5b0 = uStack_560;
  local_5a8 = local_488;
  uStack_5a0 = uStack_480;
  local_598 = local_418;
  uStack_590 = uStack_410;
  local_588 = local_558;
  uStack_580 = uStack_550;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"invalid camera specified");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AffineSpace3fa camera2world ()
    {
      AffineSpace3fa local2world = AffineSpace3fa::lookat(from, to, up);
      if (!(local2world == local2world))
        throw std::runtime_error("invalid camera specified");
      
      if (handedness == RIGHT_HANDED)
        local2world.l.vx = -local2world.l.vx;
      
      return local2world;
    }